

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O3

dictionary_t dictionary_open(char *filename,opencc_dictionary_type type)

{
  opencc_dictionary_type *__ptr;
  dictionary_t pvVar1;
  
  __ptr = (opencc_dictionary_type *)malloc(0x10);
  *__ptr = type;
  if (type == OPENCC_DICTIONARY_TYPE_DATRIE) {
    pvVar1 = dictionary_datrie_open(filename);
  }
  else {
    if (type != OPENCC_DICTIONARY_TYPE_TEXT) {
      free(__ptr);
      return (dictionary_t)0xffffffffffffffff;
    }
    pvVar1 = dictionary_text_open(filename);
  }
  *(dictionary_t *)(__ptr + 2) = pvVar1;
  return __ptr;
}

Assistant:

dictionary_t dictionary_open(const char * filename, opencc_dictionary_type type)
{
	dictionary_desc * dictionary = (dictionary_desc *) malloc(sizeof(dictionary_desc));
	dictionary->type = type;
	switch (type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		dictionary->dict = dictionary_text_open(filename);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		dictionary->dict = dictionary_datrie_open(filename);
		break;
	default:
		free(dictionary);
		dictionary = (dictionary_t) -1; /* TODO:辭典格式不支持 */
	}
	return dictionary;
}